

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O0

void Sim_SymmsTransferToMatrix(Extra_BitMat_t *pMatSymm,Vec_Int_t *vSymms,uint *pSupport)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint i_00;
  uint k;
  uint uSymm;
  int nInputs;
  int Ind2;
  int Ind1;
  int i;
  uint *pSupport_local;
  Vec_Int_t *vSymms_local;
  Extra_BitMat_t *pMatSymm_local;
  
  iVar3 = Extra_BitMatrixReadSize(pMatSymm);
  for (Ind2 = 0; Ind2 < iVar3; Ind2 = Ind2 + 1) {
    Extra_BitMatrixInsert1(pMatSymm,Ind2,Ind2);
  }
  Ind2 = 0;
  while( true ) {
    if (vSymms->nSize <= Ind2) {
      return;
    }
    uVar1 = vSymms->pArray[Ind2];
    i_00 = uVar1 & 0xffff;
    k = uVar1 >> 0x10;
    bVar2 = (byte)(uVar1 >> 0x10);
    if (((pSupport[(int)i_00 >> 5] & 1 << ((byte)i_00 & 0x1f)) != 0) !=
        ((pSupport[(int)k >> 5] & 1 << (bVar2 & 0x1f)) != 0)) break;
    if (((pSupport[(int)i_00 >> 5] & 1 << ((byte)i_00 & 0x1f)) != 0) &&
       ((pSupport[(int)k >> 5] & 1 << (bVar2 & 0x1f)) != 0)) {
      Extra_BitMatrixInsert1(pMatSymm,i_00,k);
      Extra_BitMatrixInsert2(pMatSymm,i_00,k);
    }
    Ind2 = Ind2 + 1;
  }
  __assert_fail("Sim_HasBit(pSupport, Ind1) == Sim_HasBit(pSupport, Ind2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSymStr.c"
                ,0x1c5,
                "void Sim_SymmsTransferToMatrix(Extra_BitMat_t *, Vec_Int_t *, unsigned int *)");
}

Assistant:

void Sim_SymmsTransferToMatrix( Extra_BitMat_t * pMatSymm, Vec_Int_t * vSymms, unsigned * pSupport )
{
    int i, Ind1, Ind2, nInputs;
    unsigned uSymm;
    // add diagonal elements
    nInputs = Extra_BitMatrixReadSize( pMatSymm );
    for ( i = 0; i < nInputs; i++ )
        Extra_BitMatrixInsert1( pMatSymm, i, i );
    // add non-diagonal elements
    for ( i = 0; i < vSymms->nSize; i++ )
    {
        uSymm = (unsigned)vSymms->pArray[i];
        Ind1 = (uSymm & 0xffff);
        Ind2 = (uSymm >> 16);
//printf( "%d,%d ", Ind1, Ind2 );
        // skip variables that are not in the true support
        assert( Sim_HasBit(pSupport, Ind1) == Sim_HasBit(pSupport, Ind2) );
        if ( !Sim_HasBit(pSupport, Ind1) || !Sim_HasBit(pSupport, Ind2) )
            continue;
        Extra_BitMatrixInsert1( pMatSymm, Ind1, Ind2 );
        Extra_BitMatrixInsert2( pMatSymm, Ind1, Ind2 );
    }
}